

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

LinkedList<char> * __thiscall
data_structures::LinkedList<char>::operator=(LinkedList<char> *this,LinkedList<char> *list)

{
  bool bVar1;
  ListNode<char> *this_00;
  ListNode<char> *local_30;
  ListNode<char> *_current;
  LinkedList<char> *list_local;
  LinkedList<char> *this_local;
  
  this_00 = (ListNode<char> *)operator_new(0x18);
  ListNode<char>::ListNode(this_00);
  this->_header = this_00;
  this->_tail = this->_header;
  this->_size = 0;
  local_30 = list->_header;
  while( true ) {
    bVar1 = isTail(list,local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_30 = ListNode<char>::next(local_30);
    insertToTail(this,&local_30->element);
  }
  return this;
}

Assistant:

inline
    LinkedList<T>& LinkedList<T>::operator=(const LinkedList<T>& list) {
        _header = new ListNode<T>();
        _tail = _header;
        _size = 0;
        ListNode<T>* _current = list._header;
        while (!list.isTail(_current)) {
            _current = _current->next();
            insertToTail(_current->element);
        }
        return *this;
    }